

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O3

int __thiscall MeCab::ContextID::lid(ContextID *this,char *l)

{
  const_iterator cVar1;
  ostream *poVar2;
  size_t sVar3;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,l,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)cVar1._M_node == &(this->left_)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"it != left_.end()",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"cannot find LEFT-ID  for ",0x19);
    if (l == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(l);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,l,sVar3);
    }
    die::~die((die *)&local_38);
  }
  return cVar1._M_node[2]._M_color;
}

Assistant:

int ContextID::lid(const char *l) const {
  std::map<std::string, int>::const_iterator it = left_.find(l);
  CHECK_DIE(it != left_.end())
      << "cannot find LEFT-ID  for " << l;
  return it->second;
}